

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O2

REF_STATUS ref_iso_signed_distance(REF_GRID ref_grid,REF_DBL *field,REF_DBL *distance)

{
  REF_CELL ref_cell;
  REF_NODE pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  undefined8 uVar4;
  int cell;
  long lVar5;
  char *pcVar6;
  long lVar7;
  REF_DBL *pRVar8;
  double dVar9;
  REF_SEARCH ref_search;
  REF_GRID iso_grid;
  REF_DBL *local_160;
  REF_LIST ref_list;
  REF_DBL dist;
  REF_DBL radius;
  REF_DBL *local_140;
  REF_DBL center [3];
  REF_INT cand [27];
  REF_INT nodes [27];
  
  ref_search = (REF_SEARCH)0x0;
  uVar2 = ref_iso_insert(&iso_grid,ref_grid,field,0,(REF_DBL *)0x0,(REF_DBL **)0x0);
  if (uVar2 == 0) {
    lVar7 = 0x10;
    if (ref_grid->twod == 0) {
      lVar7 = 0x28;
    }
    ref_cell = *(REF_CELL *)((long)iso_grid->cell + lVar7 + -0x10);
    uVar2 = ref_search_create(&ref_search,ref_cell->n);
    if (uVar2 == 0) {
      local_160 = distance;
      local_140 = field;
      for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
        RVar3 = ref_cell_nodes(ref_cell,cell,nodes);
        if (RVar3 == 0) {
          if (ref_grid->twod == 0) {
            uVar2 = ref_node_bounding_sphere(iso_grid->node,nodes,3,center,&radius);
            if (uVar2 != 0) {
              pcVar6 = "b";
              uVar4 = 0x163;
              goto LAB_00197a4a;
            }
          }
          else {
            uVar2 = ref_node_bounding_sphere(iso_grid->node,nodes,2,center,&radius);
            if (uVar2 != 0) {
              pcVar6 = "b";
              uVar4 = 0x15f;
              goto LAB_00197a4a;
            }
          }
          uVar2 = ref_search_insert(ref_search,cell,center,radius * 1.00000001);
          if (uVar2 != 0) {
            pcVar6 = "ins";
            uVar4 = 0x165;
            goto LAB_00197a4a;
          }
        }
      }
      uVar2 = ref_list_create(&ref_list);
      if (uVar2 == 0) {
        pRVar8 = local_160;
        for (lVar7 = 0; pRVar1 = ref_grid->node, lVar7 < pRVar1->max; lVar7 = lVar7 + 1) {
          if (-1 < pRVar1->global[lVar7]) {
            pRVar8[lVar7] = 1e+200;
            uVar2 = ref_search_nearest_candidates(ref_search,ref_list,pRVar1->real + lVar7 * 0xf);
            if (uVar2 != 0) {
              pcVar6 = "candidates";
              uVar4 = 0x16d;
              goto LAB_00197a4a;
            }
            for (lVar5 = 0; pRVar8 = local_160, lVar5 < ref_list->n; lVar5 = lVar5 + 1) {
              uVar2 = ref_cell_nodes(ref_cell,ref_list->value[lVar5],cand);
              if (uVar2 != 0) {
                pcVar6 = "cell";
                uVar4 = 0x170;
                goto LAB_00197a4a;
              }
              pRVar8 = iso_grid->node->real;
              if (ref_grid->twod == 0) {
                uVar2 = ref_search_distance3
                                  (pRVar8 + (long)cand[0] * 0xf,pRVar8 + (long)cand[1] * 0xf,
                                   pRVar8 + (long)cand[2] * 0xf,ref_grid->node->real + lVar7 * 0xf,
                                   &dist);
                if (uVar2 != 0) {
                  pcVar6 = "dist3";
                  uVar4 = 0x17d;
                  goto LAB_00197a4a;
                }
              }
              else {
                uVar2 = ref_search_distance2
                                  (pRVar8 + (long)cand[0] * 0xf,pRVar8 + (long)cand[1] * 0xf,
                                   ref_grid->node->real + lVar7 * 0xf,&dist);
                if (uVar2 != 0) {
                  pcVar6 = "dist2";
                  uVar4 = 0x176;
                  goto LAB_00197a4a;
                }
              }
              dVar9 = local_160[lVar7];
              if (dist <= local_160[lVar7]) {
                dVar9 = dist;
              }
              local_160[lVar7] = dVar9;
            }
            if (local_140[lVar7] <= 0.0 && local_140[lVar7] != 0.0) {
              local_160[lVar7] = -local_160[lVar7];
            }
            uVar2 = ref_list_erase(ref_list);
            if (uVar2 != 0) {
              pcVar6 = "reset list";
              uVar4 = 0x185;
              goto LAB_00197a4a;
            }
          }
        }
        uVar2 = ref_list_free(ref_list);
        if (uVar2 == 0) {
          uVar2 = ref_search_free(ref_search);
          if (uVar2 == 0) {
            uVar2 = ref_grid_free(iso_grid);
            if (uVar2 == 0) {
              return 0;
            }
            pcVar6 = "iso free";
            uVar4 = 0x18a;
          }
          else {
            pcVar6 = "free search";
            uVar4 = 0x188;
          }
        }
        else {
          pcVar6 = "free list";
          uVar4 = 0x187;
        }
      }
      else {
        pcVar6 = "create list";
        uVar4 = 0x167;
      }
    }
    else {
      pcVar6 = "create search";
      uVar4 = 0x15a;
    }
  }
  else {
    pcVar6 = "iso";
    uVar4 = 0x153;
  }
LAB_00197a4a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar4,
         "ref_iso_signed_distance",(ulong)uVar2,pcVar6);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_iso_signed_distance(REF_GRID ref_grid, REF_DBL *field,
                                           REF_DBL *distance) {
  REF_GRID iso_grid;
  REF_SEARCH ref_search = NULL;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cand[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius, dist;
  REF_DBL scale = 1.0 + 1.0e-8;
  REF_LIST ref_list;
  REF_INT node, item, candidate;

  RSS(ref_iso_insert(&iso_grid, ref_grid, field, 0, NULL, NULL), "iso");

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_edg(iso_grid);
  } else {
    ref_cell = ref_grid_tri(iso_grid);
  }
  RSS(ref_search_create(&ref_search, ref_cell_n(ref_cell)), "create search");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_bounding_sphere(ref_grid_node(iso_grid), nodes, 2, center,
                                   &radius),
          "b");
    } else {
      RSS(ref_node_bounding_sphere(ref_grid_node(iso_grid), nodes, 3, center,
                                   &radius),
          "b");
    }
    RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
  }
  RSS(ref_list_create(&ref_list), "create list");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    distance[node] = REF_DBL_MAX;
    RSS(ref_search_nearest_candidates(
            ref_search, ref_list,
            ref_node_xyz_ptr(ref_grid_node(ref_grid), node)),
        "candidates");
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, cand), "cell");
      if (ref_grid_twod(ref_grid)) {
        RSS(ref_search_distance2(
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[0]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[1]),
                ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &dist),
            "dist2");
      } else {
        RSS(ref_search_distance3(
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[0]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[1]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[2]),
                ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &dist),
            "dist3");
      }
      distance[node] = MIN(distance[node], dist);
    }

    /* sign distanace */
    if (0.0 > field[node]) distance[node] = -distance[node];

    RSS(ref_list_erase(ref_list), "reset list");
  }
  RSS(ref_list_free(ref_list), "free list");
  RSS(ref_search_free(ref_search), "free search");

  RSS(ref_grid_free(iso_grid), "iso free");

  return REF_SUCCESS;
}